

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  cmState *this_00;
  int iVar1;
  string *psVar2;
  char *__file;
  off_t maxFileSize;
  off_t fsize;
  string local_100;
  undefined4 local_dc;
  undefined1 local_d8 [8];
  stat st;
  undefined1 local_38 [8];
  string fullPath;
  char *fname_local;
  cmake *this_local;
  
  fullPath.field_2._8_8_ = fname;
  psVar2 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)local_38,"/");
  std::__cxx11::string::operator+=((string *)local_38,(char *)fullPath.field_2._8_8_);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_d8);
  if (iVar1 == 0) {
    this_00 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CMAKE_CACHEFILE_DIR",(allocator<char> *)((long)&fsize + 7));
    psVar2 = cmState::GetInitializedCacheValue(this_00,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fsize + 7));
    if (psVar2 == (string *)0x0) {
      cmsys::SystemTools::RemoveFile((string *)local_38);
      local_dc = 1;
    }
    else if ((long)st.st_rdev < 0xc800) {
      local_dc = 1;
    }
    else {
      local_dc = 0;
    }
  }
  else {
    local_dc = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = this->GetHomeOutputDirectory();
  fullPath += "/";
  fullPath += fname;
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}